

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int wally_addr_segwit_from_bytes
              (uchar *bytes,size_t bytes_len,char *addr_family,uint32_t flags,char **output)

{
  int iVar1;
  char *pcVar2;
  uint8_t local_a5;
  uint8_t witness_version;
  size_t sStack_a0;
  int ret;
  size_t push_size;
  char result [90];
  char **output_local;
  uint32_t flags_local;
  char *addr_family_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((((addr_family == (char *)0x0) || (flags != 0)) || (bytes == (uchar *)0x0)) ||
     ((bytes_len == 0 || (output == (char **)0x0)))) {
    bytes_local._4_4_ = -2;
  }
  else {
    if (*bytes == '\0') {
      local_a5 = '\0';
    }
    else {
      if ((*bytes < 0x51) || (0x60 < *bytes)) {
        return -2;
      }
      local_a5 = *bytes + 0xb0;
    }
    unique0x100000f1 = output;
    iVar1 = script_get_push_size_from_bytes(bytes + 1,bytes_len - 1,&stack0xffffffffffffff60);
    if (iVar1 == 0) {
      if (((local_a5 == '\0') && (sStack_a0 != 0x14)) && (sStack_a0 != 0x20)) {
        bytes_local._4_4_ = -2;
      }
      else {
        push_size._0_1_ = 0;
        iVar1 = segwit_addr_encode((char *)&push_size,addr_family,local_a5,bytes + 2,bytes_len - 2);
        if (iVar1 == 0) {
          bytes_local._4_4_ = -1;
        }
        else {
          pcVar2 = wally_strdup((char *)&push_size);
          *stack0xffffffffffffffc8 = pcVar2;
          wally_clear(&push_size,0x5a);
          bytes_local._4_4_ = -3;
          if (*stack0xffffffffffffffc8 != (char *)0x0) {
            bytes_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      bytes_local._4_4_ = -2;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_addr_segwit_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                 const char *addr_family, uint32_t flags,
                                 char **output)
{
    char result[90];
    size_t push_size;
    int ret;
    uint8_t witness_version;

    if (output)
        *output = 0;

    if (!addr_family || flags || !bytes || !bytes_len || !output)
        return WALLY_EINVAL;

    if (bytes[0] == 0)
        witness_version = 0;
    else if (bytes[0] >= OP_1 && bytes[0] <= OP_16)
        witness_version = bytes[0] - (OP_1 - 1);
    else
        return WALLY_EINVAL;

    ret = script_get_push_size_from_bytes(bytes + 1, bytes_len - 1, &push_size);
    if (ret != WALLY_OK)
        return WALLY_EINVAL;
    else if (witness_version == 0 && push_size != HASH160_LEN && push_size != SHA256_LEN)
        return WALLY_EINVAL;

    result[0] = '\0';
    if (!segwit_addr_encode(result, addr_family, witness_version, bytes + 2, bytes_len - 2))
        return WALLY_ERROR;

    *output = wally_strdup(result);
    wally_clear(result, sizeof(result));
    return *output ? WALLY_OK : WALLY_ENOMEM;
}